

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::OrderElement
          (TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  long lVar1;
  int iVar2;
  TPZAdmChunkVector<TPZConnect,_10> *pTVar3;
  long *plVar4;
  TPZConnect *pTVar5;
  TPZAdmChunkVector<TPZCompEl_*,_10> *pTVar6;
  int64_t iVar7;
  TPZCompEl **ppTVar8;
  int *piVar9;
  int64_t iVar10;
  TPZVec<int> *this_00;
  long in_RDI;
  int64_t ind;
  int64_t lastind;
  int64_t firstind;
  TPZVec<long> elorderinv;
  int64_t elsequence;
  int64_t seq;
  int64_t seqnum;
  TPZVec<int> nodeorder;
  int64_t no;
  int64_t cindex;
  int64_t ic_1;
  int64_t nc;
  TPZStack<long,_10> connectlist;
  TPZCompEl *cel;
  int64_t el;
  TPZVec<long> elconnect;
  TPZVec<long> firstelconnect;
  int64_t ic;
  int64_t nconnect;
  int64_t numelconnected;
  int64_t in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  int64_t in_stack_fffffffffffffc78;
  TPZVec<long> *in_stack_fffffffffffffc80;
  int64_t in_stack_fffffffffffffc88;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffc90;
  int64_t in_stack_fffffffffffffc98;
  TPZVec<int> *in_stack_fffffffffffffca0;
  int64_t in_stack_fffffffffffffca8;
  long lVar11;
  int64_t in_stack_fffffffffffffcb0;
  int *in_stack_fffffffffffffcb8;
  TPZVec<int> *in_stack_fffffffffffffcc0;
  int64_t local_1a0;
  TPZVec<long> local_180;
  long local_160;
  int64_t local_158;
  int64_t local_150;
  undefined4 local_144;
  TPZVec<int> local_140;
  undefined4 local_120;
  undefined4 local_11c;
  long local_118;
  int64_t local_110;
  int64_t local_108;
  long local_100;
  TPZVec<long> local_f8 [3];
  TPZCompEl *local_88;
  long local_80;
  undefined8 local_78;
  TPZVec<long> local_70;
  TPZVec<long> local_40;
  long local_20;
  int64_t local_18;
  long local_10;
  
  local_10 = 0;
  pTVar3 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
  local_18 = TPZChunkVector<TPZConnect,_10>::NElements
                       (&pTVar3->super_TPZChunkVector<TPZConnect,_10>);
  TPZVec<long>::TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68);
  plVar4 = TPZVec<long>::operator[](&local_40,0);
  *plVar4 = 0;
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffc90,
                        in_stack_fffffffffffffc88);
    iVar2 = TPZConnect::NElConnected(pTVar5);
    local_10 = local_10 + iVar2;
    plVar4 = TPZVec<long>::operator[](&local_40,local_20);
    lVar1 = *plVar4;
    TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffc90,
                        in_stack_fffffffffffffc88);
    iVar2 = TPZConnect::NElConnected(pTVar5);
    plVar4 = TPZVec<long>::operator[](&local_40,local_20 + 1);
    *plVar4 = lVar1 + iVar2;
  }
  local_78 = 0xffffffffffffffff;
  TPZVec<long>::TPZVec
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (long *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_80 = 0;
  while( true ) {
    lVar1 = local_80;
    pTVar6 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
    iVar7 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                      (&pTVar6->super_TPZChunkVector<TPZCompEl_*,_10>);
    if (iVar7 <= lVar1) break;
    TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_88 = *ppTVar8;
    if (local_88 != (TPZCompEl *)0x0) {
      TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffc80);
      (**(code **)(*(long *)local_88 + 0x1e0))(local_88,local_f8);
      local_100 = TPZVec<long>::NElements(local_f8);
      for (local_108 = 0; local_108 < local_100; local_108 = local_108 + 1) {
        plVar4 = TPZVec<long>::operator[](local_f8,local_108);
        lVar1 = local_80;
        local_110 = *plVar4;
        plVar4 = TPZVec<long>::operator[](&local_40,local_110);
        plVar4 = TPZVec<long>::operator[](&local_70,*plVar4);
        *plVar4 = lVar1;
        plVar4 = TPZVec<long>::operator[](&local_40,local_110);
        *plVar4 = *plVar4 + 1;
      }
      TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1dbed94);
    }
    local_80 = local_80 + 1;
  }
  plVar4 = TPZVec<long>::operator[](&local_40,0);
  *plVar4 = 0;
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    plVar4 = TPZVec<long>::operator[](&local_40,local_20);
    lVar1 = *plVar4;
    TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffc90,
                        in_stack_fffffffffffffc88);
    iVar2 = TPZConnect::NElConnected(pTVar5);
    plVar4 = TPZVec<long>::operator[](&local_40,local_20 + 1);
    *plVar4 = lVar1 + iVar2;
  }
  local_118 = 0;
  while( true ) {
    lVar1 = local_118;
    pTVar3 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    iVar7 = TPZChunkVector<TPZConnect,_10>::NElements(&pTVar3->super_TPZChunkVector<TPZConnect,_10>)
    ;
    if (iVar7 <= lVar1) break;
    local_118 = local_118 + 1;
  }
  pTVar6 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  TPZChunkVector<TPZCompEl_*,_10>::NElements(&pTVar6->super_TPZChunkVector<TPZCompEl_*,_10>);
  local_11c = 0xffffffff;
  TPZVec<int>::Resize(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                      (int *)in_stack_fffffffffffffc90);
  local_120 = 0xffffffff;
  TPZVec<int>::Fill(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                    in_stack_fffffffffffffca8);
  pTVar3 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
  TPZChunkVector<TPZConnect,_10>::NElements(&pTVar3->super_TPZChunkVector<TPZConnect,_10>);
  local_144 = 0xffffffff;
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                      (int *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  plVar4 = TPZVec<long>::operator[](&local_40,0);
  *plVar4 = 0;
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffc90,
                        in_stack_fffffffffffffc88);
    local_150 = TPZConnect::SequenceNumber(pTVar5);
    if (-1 < local_150) {
      iVar2 = (int)local_20;
      piVar9 = TPZVec<int>::operator[](&local_140,local_150);
      *piVar9 = iVar2;
    }
  }
  local_160 = 0;
  pTVar6 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  TPZChunkVector<TPZCompEl_*,_10>::NElements(&pTVar6->super_TPZChunkVector<TPZCompEl_*,_10>);
  TPZVec<long>::TPZVec
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (long *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  for (local_158 = 0; local_158 < local_18; local_158 = local_158 + 1) {
    piVar9 = TPZVec<int>::operator[](&local_140,local_158);
    local_20 = (long)*piVar9;
    if (local_20 != -1) {
      plVar4 = TPZVec<long>::operator[](&local_40,local_20);
      local_1a0 = *plVar4;
      plVar4 = TPZVec<long>::operator[](&local_40,local_20 + 1);
      lVar1 = *plVar4;
      for (; local_1a0 < lVar1; local_1a0 = local_1a0 + 1) {
        plVar4 = TPZVec<long>::operator[](&local_70,local_1a0);
        local_80 = *plVar4;
        if ((local_80 != -1) &&
           (plVar4 = TPZVec<long>::operator[](&local_180,local_80), *plVar4 == -1)) {
          lVar11 = local_160;
          local_160 = local_160 + 1;
          plVar4 = TPZVec<long>::operator[](&local_180,local_80);
          *plVar4 = lVar11;
        }
      }
    }
  }
  local_160 = 0;
  local_158 = 0;
  while( true ) {
    iVar7 = local_158;
    pTVar6 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
    iVar10 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                       (&pTVar6->super_TPZChunkVector<TPZCompEl_*,_10>);
    if (iVar10 <= iVar7) break;
    plVar4 = TPZVec<long>::operator[](&local_180,local_158);
    if (*plVar4 != -1) {
      in_stack_fffffffffffffc74 = (int)local_158;
      this_00 = (TPZVec<int> *)(in_RDI + 0xb0);
      plVar4 = TPZVec<long>::operator[](&local_180,local_158);
      piVar9 = TPZVec<int>::operator[](this_00,*plVar4);
      *piVar9 = in_stack_fffffffffffffc74;
    }
    local_158 = local_158 + 1;
  }
  TPZVec<long>::~TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  TPZVec<int>::~TPZVec((TPZVec<int> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70))
  ;
  TPZVec<long>::~TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  TPZVec<long>::~TPZVec
            ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::OrderElement()//TPZVec<int> &elorder)
{
	int64_t numelconnected = 0;
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	int64_t ic;
	//firstelconnect contains the first element index in the elconnect vector
	TPZVec<int64_t> firstelconnect(nconnect+1);
	firstelconnect[0] = 0;
	for(ic=0; ic<nconnect; ic++) {
		numelconnected += this->fMesh->ConnectVec()[ic].NElConnected();
		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
	}
#ifdef PZDEBUG
    TPZVec<int64_t> firstel_copy(firstelconnect);
#endif
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<<"numelconnected " << numelconnected << endl;
		sout<< "firstelconnect "<< firstelconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//cout << "numelconnected " << numelconnected << endl;
	//cout << "firstelconnect ";
	//  for(ic=0; ic<nconnect; ic++) cout << firstelconnect[ic] << ' ';
  	TPZVec<int64_t> elconnect(numelconnected,-1);
  	int64_t el;
  	TPZCompEl *cel;
  	for(el=0; el<this->fMesh->ElementVec().NElements(); el++) {
  		cel = this->fMesh->ElementVec()[el];
  		if(!cel) continue;
  		TPZStack<int64_t> connectlist;
  		cel->BuildConnectList(connectlist);
  		int64_t nc = connectlist.NElements();
  		int64_t ic;
  		for(ic=0; ic<nc; ic++) {
  			int64_t cindex = connectlist[ic];
#ifdef PZDEBUG
            if(firstelconnect[cindex] >= firstel_copy[cindex+1])
            {
                std::cout << "firstelconnect " << firstelconnect << std::endl;
                std::cout << "firstel_copy " << firstel_copy << std::endl;
                DebugStop();
            }
#endif
  			elconnect[firstelconnect[cindex]] = el;
  			firstelconnect[cindex]++;
  		}
  	}
	//  for(ic=0; ic<numelconnected; ic++) cout << elconnect[ic] << endl;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<< "elconnect "<< elconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
  	}
	//cout << "elconnect\n";
	//  int no;
	for(int64_t no=0; no< this->fMesh->ConnectVec().NElements(); no++) {
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout<< "Node index " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		//cout << "no numero " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
		//       for(ic=firstelconnect[no]; ic<firstelconnect[no+1];ic++) cout << elconnect[ic] << ' ';
		//cout << endl;
	}
	
	
  	fElementOrder.Resize(this->fMesh->ElementVec().NElements(),-1);
  	fElementOrder.Fill(-1);
  	TPZVec<int> nodeorder(this->fMesh->ConnectVec().NElements(),-1);
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		int64_t seqnum = this->fMesh->ConnectVec()[ic].SequenceNumber();
  		if(seqnum >= 0) nodeorder[seqnum] = ic;
  	}
	//  cout << "nodeorder ";
	/*for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) cout << nodeorder[ic] << ' ';
	 cout << endl;
	 cout.flush();*/
  	int64_t seq;
  	int64_t elsequence = 0;
  	TPZVec<int64_t> elorderinv(this->fMesh->ElementVec().NElements(),-1);
  	for(seq=0; seq<nconnect; seq++) {
  		ic = nodeorder[seq];
  		if(ic == -1) continue;
  		int64_t firstind = firstelconnect[ic];
  		int64_t lastind = firstelconnect[ic+1];
  		int64_t ind;
  		for(ind=firstind; ind<lastind; ind++) {
  			el = elconnect[ind];
			if(el == -1) {
				continue;
			}
  			if(elorderinv[el]==-1) elorderinv[el] = elsequence++;
  		}
  	}
	//  cout << "elorderinv ";
	//  for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) cout << elorderinv[seq] << ' ';
	//  cout << endl;
  	elsequence = 0;
  	for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) {
  		if(elorderinv[seq] == -1) continue;
  		fElementOrder[elorderinv[seq]] = seq;
  	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        sout << "element order " << fElementOrder << std::endl;
		sout<< "elorderinv " << elorderinv << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//  cout << "elorder" << endl;
	//  for(ic=0; ic<this->fMesh->ElementVec().NElements(); ic++) cout << elorder[ic] << endl;
	
}